

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

void __thiscall Assimp::FBXExporter::WriteBinaryFooter(FBXExporter *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  StreamWriterLE outstream;
  shared_ptr<Assimp::IOStream> local_60;
  StreamWriter<false,_false> local_50;
  
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,FBX::NULL_RECORD_abi_cxx11_,DAT_008cd958,1);
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,FBX::GENERIC_FOOTID_abi_cxx11_,DAT_008cda18,1);
  iVar2 = (*((this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_IOStream[5])();
  uVar3 = CONCAT44(extraout_var,iVar2) | 0xfffffffffffffff0;
  do {
    peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar1->_vptr_IOStream[3])(peVar1,"",1,1);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0);
  lVar4 = 4;
  do {
    peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar1->_vptr_IOStream[3])(peVar1,"",1,1);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  StreamWriter<false,_false>::StreamWriter(&local_50,&local_60,false);
  if (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  StreamWriter<false,_false>::Put<unsigned_int>(&local_50,0x1ce8);
  StreamWriter<false,_false>::~StreamWriter(&local_50);
  lVar4 = 0x78;
  do {
    peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar1->_vptr_IOStream[3])(peVar1,"",1,1);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,FBX::FOOT_MAGIC_abi_cxx11_,DAT_008cda38,1);
  return;
}

Assistant:

void FBXExporter::WriteBinaryFooter()
{
    outfile->Write(NULL_RECORD.c_str(), NULL_RECORD.size(), 1);

    outfile->Write(GENERIC_FOOTID.c_str(), GENERIC_FOOTID.size(), 1);

    // here some padding is added for alignment to 16 bytes.
    // if already aligned, the full 16 bytes is added.
    size_t pos = outfile->Tell();
    size_t pad = 16 - (pos % 16);
    for (size_t i = 0; i < pad; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // not sure what this is, but it seems to always be 0 in modern files
    for (size_t i = 0; i < 4; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // now the file version again
    {
        StreamWriterLE outstream(outfile);
        outstream.PutU4(EXPORT_VERSION_INT);
    } // StreamWriter destructor writes the data to the file

    // and finally some binary footer added to all files
    for (size_t i = 0; i < 120; ++i) {
        outfile->Write("\x00", 1, 1);
    }
    outfile->Write(FOOT_MAGIC.c_str(), FOOT_MAGIC.size(), 1);
}